

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  secp256k1_modinv32_signed30 *b;
  uint uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar12;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar13;
  long lVar14;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar15;
  long *extraout_RDX_01;
  uint uVar16;
  secp256k1_modinv32_modinfo *psVar17;
  secp256k1_modinv32_modinfo *modinfo_00;
  int *piVar18;
  secp256k1_modinv32_signed30 *psVar19;
  ulong uVar20;
  uint64_t uVar21;
  secp256k1_modinv32_signed30 *psVar22;
  secp256k1_fe *psVar23;
  ulong uVar24;
  secp256k1_fe *r;
  secp256k1_modinv32_modinfo *psVar25;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar26;
  ulong uVar27;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar28;
  uchar *__s;
  uint uVar29;
  ulong uVar30;
  secp256k1_modinv32_modinfo *psVar31;
  uint uVar32;
  uint uVar33;
  int *piVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  secp256k1_modinv32_signed30 *psVar39;
  uint uVar40;
  uint uVar41;
  secp256k1_modinv32_modinfo *unaff_R13;
  secp256k1_modinv32_modinfo *psVar42;
  secp256k1_modinv32_signed30 *psVar43;
  uint64_t uVar44;
  size_t count;
  uint uVar45;
  uint uVar46;
  secp256k1_modinv32_modinfo *psVar47;
  uint64_t uVar48;
  secp256k1_fe *a_03;
  uint uVar49;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *psVar50;
  uint64_t uVar51;
  code *pcVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  ulong uStack_1590;
  secp256k1_fe *psStack_1588;
  uchar auStack_1580 [4232];
  secp256k1_fe *psStack_4f8;
  ulong uStack_4f0;
  uint64_t uStack_4e8;
  secp256k1_fe *psStack_4e0;
  code *pcStack_4d8;
  code *pcStack_4d0;
  undefined1 auStack_4c8 [36];
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  undefined1 auStack_488 [48];
  code *pcStack_458;
  long lStack_448;
  secp256k1_fe sStack_440;
  secp256k1_fe *psStack_408;
  secp256k1_fe sStack_400;
  secp256k1_fe sStack_3d0;
  ulong uStack_398;
  ulong uStack_390;
  ulong uStack_388;
  secp256k1_modinv32_signed30 *psStack_380;
  ulong uStack_378;
  code *pcStack_370;
  uint uStack_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  secp256k1_modinv32_signed30 *psStack_350;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  uint uStack_338;
  int32_t iStack_334;
  secp256k1_modinv32_signed30 *psStack_330;
  secp256k1_modinv32_signed30 *psStack_328;
  secp256k1_modinv32_signed30 *psStack_320;
  secp256k1_modinv32_signed30 *psStack_318;
  secp256k1_modinv32_signed30 *psStack_310;
  code *pcStack_308;
  long lStack_2f8;
  long lStack_2f0;
  int *piStack_2e8;
  ulong uStack_2e0;
  secp256k1_modinv32_modinfo *psStack_2d8;
  secp256k1_modinv32_modinfo *psStack_2c8;
  code *pcStack_2c0;
  secp256k1_modinv32_signed30 *psStack_2b8;
  int *piStack_2a8;
  ulong uStack_2a0;
  secp256k1_modinv32_modinfo *psStack_298;
  secp256k1_modinv32_modinfo *psStack_288;
  code *pcStack_280;
  secp256k1_modinv32_signed30 sStack_278;
  secp256k1_modinv32_signed30 sStack_254;
  secp256k1_modinv32_modinfo *psStack_230;
  secp256k1_modinv32_modinfo *psStack_228;
  secp256k1_modinv32_modinfo *psStack_218;
  int iStack_20c;
  uint uStack_208;
  uint uStack_204;
  secp256k1_modinv32_trans2x2 sStack_200;
  secp256k1_modinv32_modinfo sStack_1f0;
  secp256k1_modinv32_modinfo *psStack_1c8;
  long lStack_1c0;
  undefined8 uStack_1b8;
  secp256k1_modinv32_modinfo sStack_1b0;
  undefined1 auStack_180 [40];
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  secp256k1_modinv32_modinfo *psStack_138;
  ulong uStack_130;
  secp256k1_modinv32_modinfo *psStack_128;
  secp256k1_modinv32_modinfo *psStack_120;
  secp256k1_modinv32_modinfo *psStack_118;
  secp256k1_modinv32_modinfo *psStack_110;
  int local_104;
  secp256k1_modinv32_modinfo *local_100;
  secp256k1_modinv32_trans2x2 local_f8;
  secp256k1_modinv32_modinfo local_e8;
  secp256k1_modinv32_modinfo *local_b8;
  undefined8 local_b0;
  secp256k1_modinv32_modinfo local_a8;
  undefined1 local_78 [40];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_78._16_4_ = 0;
  local_78._20_4_ = 0;
  local_78._24_4_ = 0;
  local_78._28_4_ = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._32_4_ = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_78._36_4_ = 1;
  local_e8.modulus.v[8] = (modinfo->modulus).v[8];
  local_e8.modulus.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_e8.modulus.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_e8.modulus.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_e8.modulus.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_a8.modulus.v[8] = x->v[8];
  local_a8.modulus.v._0_8_ = *(undefined8 *)x->v;
  local_a8.modulus.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_a8.modulus.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_a8.modulus.v._24_8_ = *(undefined8 *)(x->v + 6);
  local_104 = 0;
  uVar38 = 0xffffffff;
  local_100 = (secp256k1_modinv32_modinfo *)0x9;
  local_b8 = (secp256k1_modinv32_modinfo *)x;
  local_b0 = modinfo;
LAB_00149be3:
  modinfo_00 = local_b0;
  psVar50 = local_100;
  psVar42 = (secp256k1_modinv32_modinfo *)(local_e8.modulus.v._0_8_ & 0xffffffff);
  psVar25 = (secp256k1_modinv32_modinfo *)(local_a8.modulus.v._0_8_ & 0xffffffff);
  uVar33 = 1;
  psVar31 = (secp256k1_modinv32_modinfo *)0x0;
  iVar3 = 0x1e;
  uVar11 = 0;
  psVar17 = (secp256k1_modinv32_modinfo *)0x1;
  uVar32 = local_e8.modulus.v[0];
  uVar29 = local_a8.modulus.v[0];
  while( true ) {
    uVar45 = -1 << ((byte)iVar3 & 0x1f) | uVar29;
    iVar7 = 0;
    if (uVar45 != 0) {
      for (; (uVar45 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
      }
    }
    bVar6 = (byte)iVar7;
    uVar29 = uVar29 >> (bVar6 & 0x1f);
    uVar16 = (int)psVar17 << (bVar6 & 0x1f);
    psVar17 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
    uVar11 = uVar11 << (bVar6 & 0x1f);
    uVar35 = (int)uVar38 - iVar7;
    uVar38 = (ulong)uVar35;
    iVar3 = iVar3 - iVar7;
    iVar7 = (int)psVar31;
    if (iVar3 == 0) break;
    if ((uVar32 & 1) == 0) {
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a027;
      secp256k1_modinv32_var_cold_7();
LAB_0014a027:
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a02c;
      secp256k1_modinv32_var_cold_6();
LAB_0014a02c:
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)uVar45;
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a031;
      secp256k1_modinv32_var_cold_1();
LAB_0014a031:
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a036;
      secp256k1_modinv32_var_cold_2();
LAB_0014a036:
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a03b;
      secp256k1_modinv32_var_cold_5();
LAB_0014a03b:
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a040;
      secp256k1_modinv32_var_cold_4();
      goto LAB_0014a040;
    }
    if ((uVar29 & 1) == 0) goto LAB_0014a027;
    uVar45 = uVar11 * local_a8.modulus.v[0] + uVar16 * local_e8.modulus.v[0];
    bVar6 = 0x1e - (char)iVar3;
    uVar40 = uVar32 << (bVar6 & 0x1f);
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
    if (uVar45 != uVar40) goto LAB_0014a02c;
    uVar45 = uVar33 * local_a8.modulus.v[0] + iVar7 * local_e8.modulus.v[0];
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar45;
    uVar40 = uVar29 << (bVar6 & 0x1f);
    psVar47 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
    if (uVar45 != uVar40) goto LAB_0014a031;
    if (uVar35 - 0x2f0 < 0xfffffa21) goto LAB_0014a036;
    psVar47 = psVar31;
    if ((int)uVar35 < 0) {
      uVar38 = (ulong)-uVar35;
      uVar45 = -uVar32;
      uVar35 = -uVar11;
      psVar17 = psVar31;
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)-uVar16;
      uVar32 = uVar29;
      uVar29 = uVar45;
      uVar11 = uVar33;
      uVar33 = uVar35;
    }
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar33;
    iVar7 = (int)uVar38 + 1;
    if (iVar3 <= iVar7) {
      iVar7 = iVar3;
    }
    if (iVar7 - 0x1fU < 0xffffffe2) goto LAB_0014a03b;
    uVar16 = (uint)(0xff << (-(char)iVar7 & 0x1fU)) >> (-(char)iVar7 & 0x1fU);
    unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
    uVar45 = secp256k1_modinv32_inv256[uVar32 >> 1 & 0x7f] * uVar29 & uVar16;
    uVar29 = uVar29 + uVar45 * uVar32;
    psVar31 = (secp256k1_modinv32_modinfo *)(ulong)(uVar45 * (int)psVar17 + (int)psVar47);
    uVar33 = uVar45 * uVar11 + uVar33;
    if ((uVar29 & uVar16) != 0) {
LAB_0014a040:
      psStack_110 = (secp256k1_modinv32_modinfo *)0x14a045;
      secp256k1_modinv32_var_cold_3();
      psVar50 = psVar47;
      goto LAB_0014a045;
    }
  }
  local_f8.u = uVar16;
  local_f8.v = uVar11;
  local_f8.q = iVar7;
  local_f8.r = uVar33;
  if ((long)(int)uVar33 * (long)(int)uVar16 - (long)iVar7 * (long)(int)uVar11 == 0x40000000) {
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149d89;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)local_78,
               (secp256k1_modinv32_signed30 *)(local_78 + 0x24),&local_f8,local_b0);
    unaff_R15 = &local_e8;
    iVar7 = (int)psVar50;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149da1;
    psVar42 = psVar50;
    psVar25 = unaff_R15;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar7,&modinfo_00->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a04a;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149dbc;
    psVar42 = psVar50;
    psVar25 = unaff_R15;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar7,&modinfo_00->modulus,1);
    if (0 < iVar3) goto LAB_0014a04f;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149dd7;
    psVar42 = psVar50;
    psVar25 = &local_a8;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_a8.modulus,iVar7,&modinfo_00->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a054;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149df2;
    psVar42 = psVar50;
    psVar25 = &local_a8;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_a8.modulus,iVar7,&modinfo_00->modulus,1);
    if (-1 < iVar3) goto LAB_0014a059;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149e0f;
    secp256k1_modinv32_update_fg_30_var(iVar7,&local_e8.modulus,&local_a8.modulus,&local_f8);
    if (local_a8.modulus.v[0] == 0) {
      if (1 < iVar7) {
        uVar33 = 0;
        psVar25 = (secp256k1_modinv32_modinfo *)0x1;
        do {
          uVar33 = uVar33 | local_a8.modulus.v[(long)psVar25];
          psVar25 = (secp256k1_modinv32_modinfo *)((long)(psVar25->modulus).v + 1);
        } while (psVar50 != psVar25);
        if (uVar33 != 0) goto LAB_00149e3e;
      }
      psVar25 = &local_a8;
      psStack_110 = (secp256k1_modinv32_modinfo *)0x149f1a;
      psVar42 = psVar50;
      iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar25->modulus,iVar7,&SECP256K1_SIGNED30_ONE,0);
      psVar17 = psVar50;
      if (iVar3 != 0) goto LAB_0014a077;
      psStack_110 = (secp256k1_modinv32_modinfo *)0x149f3b;
      iVar3 = secp256k1_modinv32_mul_cmp_30(&local_e8.modulus,iVar7,&SECP256K1_SIGNED30_ONE,-1);
      psVar17 = local_b8;
      if (iVar3 != 0) {
        psStack_110 = (secp256k1_modinv32_modinfo *)0x149f64;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&local_e8.modulus,iVar7,&SECP256K1_SIGNED30_ONE,1);
        if (iVar3 != 0) {
          psVar42 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_110 = (secp256k1_modinv32_modinfo *)0x149f7e;
          psVar25 = psVar17;
          iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar3 != 0) goto LAB_0014a07c;
          psVar25 = (secp256k1_modinv32_modinfo *)local_78;
          psVar42 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_110 = (secp256k1_modinv32_modinfo *)0x149fa1;
          iVar3 = secp256k1_modinv32_mul_cmp_30
                            ((secp256k1_modinv32_signed30 *)psVar25,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar3 != 0) goto LAB_0014a07c;
          psStack_110 = (secp256k1_modinv32_modinfo *)0x149fbe;
          iVar3 = secp256k1_modinv32_mul_cmp_30(&local_e8.modulus,iVar7,&modinfo_00->modulus,1);
          if (iVar3 != 0) {
            psVar25 = &local_e8;
            psStack_110 = (secp256k1_modinv32_modinfo *)0x149fd7;
            psVar42 = psVar50;
            iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar25->modulus,iVar7,&modinfo_00->modulus,-1);
            if (iVar3 != 0) goto LAB_0014a07c;
          }
        }
      }
      psStack_110 = (secp256k1_modinv32_modinfo *)0x149ff9;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)local_78,local_e8.modulus.v[(long)iVar7 + -1],
                 modinfo_00);
      (psVar17->modulus).v[8] = local_78._32_4_;
      *(undefined8 *)((psVar17->modulus).v + 4) = local_78._16_8_;
      *(undefined8 *)((psVar17->modulus).v + 6) = local_78._24_8_;
      *(undefined8 *)(psVar17->modulus).v = local_78._0_8_;
      *(undefined8 *)((psVar17->modulus).v + 2) = local_78._8_8_;
      return;
    }
LAB_00149e3e:
    uVar33 = local_e8.modulus.v[(long)iVar7 + -1];
    uVar32 = *(uint *)((long)&local_b0 + (long)iVar7 * 4 + 4);
    iVar3 = iVar7 + -2;
    uVar29 = (int)uVar33 >> 0x1f ^ uVar33 | iVar3 >> 0x1f;
    psVar25 = (secp256k1_modinv32_modinfo *)(ulong)uVar29;
    uVar29 = (int)uVar32 >> 0x1f ^ uVar32 | uVar29;
    psVar42 = (secp256k1_modinv32_modinfo *)(ulong)uVar29;
    if (uVar29 == 0) {
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)(iVar7 - 1);
      piVar13 = local_e8.modulus.v + iVar3;
      *piVar13 = *piVar13 | uVar33 << 0x1e;
      piVar13 = local_a8.modulus.v + iVar3;
      *piVar13 = *piVar13 | uVar32 << 0x1e;
    }
    unaff_R15 = &local_e8;
    if (local_104 == 0x18) goto LAB_0014a05e;
    iVar7 = (int)psVar50;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149e9d;
    psVar42 = psVar50;
    psVar25 = unaff_R15;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar7,&modinfo_00->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a063;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149eb8;
    psVar42 = psVar50;
    psVar25 = unaff_R15;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar7,&modinfo_00->modulus,1);
    if (0 < iVar3) goto LAB_0014a068;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149ed3;
    psVar42 = psVar50;
    psVar25 = &local_a8;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_a8.modulus,iVar7,&modinfo_00->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a06d;
    psStack_110 = (secp256k1_modinv32_modinfo *)0x149eee;
    psVar42 = psVar50;
    psVar25 = &local_a8;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_a8.modulus,iVar7,&modinfo_00->modulus,1);
    if (-1 < iVar3) goto LAB_0014a072;
    local_104 = local_104 + 1;
    local_100 = psVar50;
    goto LAB_00149be3;
  }
LAB_0014a045:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a04a;
  secp256k1_modinv32_var_cold_8();
  modinfo_00 = psVar17;
LAB_0014a04a:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a04f;
  secp256k1_modinv32_var_cold_19();
LAB_0014a04f:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a054;
  secp256k1_modinv32_var_cold_18();
LAB_0014a054:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a059;
  secp256k1_modinv32_var_cold_17();
LAB_0014a059:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a05e;
  secp256k1_modinv32_var_cold_16();
LAB_0014a05e:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a063;
  secp256k1_modinv32_var_cold_13();
LAB_0014a063:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a068;
  secp256k1_modinv32_var_cold_12();
LAB_0014a068:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a06d;
  secp256k1_modinv32_var_cold_11();
LAB_0014a06d:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a072;
  secp256k1_modinv32_var_cold_10();
LAB_0014a072:
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a077;
  secp256k1_modinv32_var_cold_9();
  psVar17 = psVar50;
LAB_0014a077:
  psVar50 = unaff_R15;
  psStack_110 = (secp256k1_modinv32_modinfo *)0x14a07c;
  secp256k1_modinv32_var_cold_14();
LAB_0014a07c:
  psStack_110 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_110 = &local_a8;
  psStack_118 = psVar50;
  psStack_120 = psVar17;
  psStack_128 = unaff_R13;
  uStack_130 = uVar38;
  psStack_138 = modinfo_00;
  auStack_180._16_4_ = 0;
  auStack_180._20_4_ = 0;
  auStack_180._24_4_ = 0;
  auStack_180._28_4_ = 0;
  auStack_180._0_4_ = 0;
  auStack_180._4_4_ = 0;
  auStack_180._8_4_ = 0;
  auStack_180._12_4_ = 0;
  auStack_180._32_4_ = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  auStack_180._36_4_ = 1;
  sStack_1f0.modulus.v[8] = (psVar42->modulus).v[8];
  sStack_1f0.modulus.v._16_8_ = *(undefined8 *)((psVar42->modulus).v + 4);
  sStack_1f0.modulus.v._24_8_ = *(undefined8 *)((psVar42->modulus).v + 6);
  sStack_1f0.modulus.v._0_8_ = *(undefined8 *)(psVar42->modulus).v;
  sStack_1f0.modulus.v._8_8_ = *(undefined8 *)((psVar42->modulus).v + 2);
  sStack_1b0.modulus.v[8] = (psVar25->modulus).v[8];
  sStack_1b0.modulus.v._0_8_ = *(undefined8 *)(psVar25->modulus).v;
  sStack_1b0.modulus.v._8_8_ = *(undefined8 *)((psVar25->modulus).v + 2);
  psStack_1c8 = psVar25;
  sStack_1b0.modulus.v._16_8_ = *(undefined8 *)((psVar25->modulus).v + 4);
  sStack_1b0.modulus.v._24_8_ = *(undefined8 *)((psVar25->modulus).v + 6);
  iVar3 = 0;
  uVar38 = 0xffffffff;
  psStack_218 = psVar42;
  do {
    uStack_1b8 = (ulong)sStack_1f0.modulus.v[0];
    uVar20 = (ulong)sStack_1b0.modulus.v[0];
    uVar9 = 0;
    psVar25 = (secp256k1_modinv32_modinfo *)0x1;
    uVar33 = 0;
    uVar11 = 0;
    uVar45 = 1;
    uVar32 = sStack_1b0.modulus.v[0];
    uVar29 = sStack_1f0.modulus.v[0];
    do {
      uVar16 = sStack_1f0.modulus.v[0];
      iStack_20c = iVar3;
      if ((uVar29 & 1) == 0) {
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a55e;
        secp256k1_modinv32_cold_17();
LAB_0014a55e:
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a563;
        secp256k1_modinv32_cold_1();
LAB_0014a563:
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a568;
        secp256k1_modinv32_cold_2();
        psVar42 = unaff_R13;
LAB_0014a568:
        uVar45 = uVar16;
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a56d;
        secp256k1_modinv32_cold_16();
        goto LAB_0014a56d;
      }
      uVar40 = (uint)psVar25;
      uVar46 = uVar33 * sStack_1b0.modulus.v[0] + uVar40 * sStack_1f0.modulus.v[0];
      psVar17 = (secp256k1_modinv32_modinfo *)(ulong)uVar46;
      uVar35 = uVar29 << ((byte)uVar9 & 0x1f);
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
      if (uVar46 != uVar35) goto LAB_0014a55e;
      uVar46 = uVar45 * sStack_1b0.modulus.v[0] + uVar11 * sStack_1f0.modulus.v[0];
      psVar17 = (secp256k1_modinv32_modinfo *)(ulong)uVar46;
      uVar35 = uVar32 << ((byte)uVar9 & 0x1f);
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
      if (uVar46 != uVar35) goto LAB_0014a563;
      uStack_204 = (int)(uint)uVar38 >> 0x1f;
      psVar17 = (secp256k1_modinv32_modinfo *)(ulong)uStack_204;
      uStack_208 = uVar32 & 1;
      uVar35 = -uStack_208;
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
      uVar46 = uStack_204 & uVar35;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar46;
      uVar36 = (uint)uVar38 ^ uVar46;
      uVar38 = (ulong)uVar36;
      psVar42 = (secp256k1_modinv32_modinfo *)(ulong)(uVar36 - 0x25b);
      if (uVar36 - 0x25b < 0xfffffb4d) goto LAB_0014a568;
      uVar38 = (ulong)(uVar36 - 1);
      uVar45 = uVar45 + ((uStack_204 ^ uVar33) - uStack_204 & uVar35);
      uVar33 = (uVar33 + (uVar45 & uVar46)) * 2;
      uVar11 = uVar11 + ((uStack_204 ^ uVar40) - uStack_204 & uVar35);
      uVar16 = (uVar40 + (uVar11 & uVar46)) * 2;
      psVar25 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
      uVar35 = ((uStack_204 ^ uVar29) - uStack_204 & uVar35) + uVar32;
      uVar32 = uVar35 >> 1;
      uVar35 = uVar35 & uVar46;
      unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
      uVar29 = uVar29 + uVar35;
      uVar35 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar35;
    } while (uVar35 != 0x1e);
    psVar17 = (secp256k1_modinv32_modinfo *)(long)(int)uVar16;
    psVar42 = (secp256k1_modinv32_modinfo *)(long)(int)uVar33;
    psVar50 = (secp256k1_modinv32_modinfo *)(long)(int)uVar11;
    uVar9 = (long)psVar17 * (long)(int)uVar45 - (long)psVar42 * (long)psVar50;
    sStack_200.u = uVar16;
    sStack_200.v = uVar33;
    sStack_200.q = uVar11;
    sStack_200.r = uVar45;
    if (uVar9 != 0x40000000) {
LAB_0014a56d:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a572;
      secp256k1_modinv32_cold_3();
LAB_0014a572:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a577;
      secp256k1_modinv32_cold_15();
LAB_0014a577:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a57c;
      secp256k1_modinv32_cold_14();
LAB_0014a57c:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a581;
      secp256k1_modinv32_cold_13();
LAB_0014a581:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a586;
      secp256k1_modinv32_cold_12();
LAB_0014a586:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a58b;
      secp256k1_modinv32_cold_4();
LAB_0014a58b:
      unaff_R13 = psVar42;
      uVar33 = (uint)uVar9;
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a590;
      secp256k1_modinv32_cold_5();
LAB_0014a590:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a595;
      secp256k1_modinv32_cold_11();
LAB_0014a595:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a59a;
      secp256k1_modinv32_cold_10();
LAB_0014a59a:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a59f;
      secp256k1_modinv32_cold_9();
LAB_0014a59f:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a5a4;
      secp256k1_modinv32_cold_8();
      goto LAB_0014a5a4;
    }
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a273;
    lStack_1c0 = (long)(int)uVar45;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_180,
               (secp256k1_modinv32_signed30 *)(auStack_180 + 0x24),&sStack_200,psStack_218);
    modinfo_00 = &sStack_1f0;
    uVar45 = 9;
    uVar9 = 0xffffffff;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a28f;
    psVar25 = modinfo_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&modinfo_00->modulus,9,&psStack_218->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a572;
    uVar45 = 9;
    uVar9 = 1;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a2ae;
    psVar25 = modinfo_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&modinfo_00->modulus,9,&psStack_218->modulus,1);
    if (0 < iVar3) goto LAB_0014a577;
    modinfo_00 = &sStack_1b0;
    uVar45 = 9;
    uVar9 = 0xffffffff;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a2d2;
    psVar25 = modinfo_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&modinfo_00->modulus,9,&psStack_218->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a57c;
    uVar45 = 9;
    uVar9 = 1;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a2f1;
    psVar25 = modinfo_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&modinfo_00->modulus,9,&psStack_218->modulus,1);
    unaff_R13 = psStack_218;
    if (-1 < iVar3) goto LAB_0014a581;
    modinfo_00 = (secp256k1_modinv32_modinfo *)((long)psVar42 * uVar20 + (long)psVar17 * uStack_1b8)
    ;
    uVar9 = uStack_1b8;
    if (((ulong)modinfo_00 & 0x3ffffffe) != 0) goto LAB_0014a586;
    uVar9 = uStack_1b8 * (long)psVar50;
    uVar20 = uVar20 * lStack_1c0 + uVar9;
    if ((uVar20 & 0x3fffffff) != 0) goto LAB_0014a58b;
    uVar20 = (long)uVar20 >> 0x1e;
    modinfo_00 = (secp256k1_modinv32_modinfo *)((long)modinfo_00 >> 0x1e);
    lVar5 = 1;
    do {
      lVar10 = (long)sStack_1f0.modulus.v[lVar5];
      lVar12 = (long)sStack_1b0.modulus.v[lVar5];
      lVar14 = (long)(modinfo_00->modulus).v + lVar12 * (long)psVar42 + lVar10 * (long)psVar17;
      lVar10 = lVar12 * lStack_1c0 + lVar10 * (long)psVar50 + uVar20;
      sStack_1f0.modulus.v[lVar5 + -1] = (uint)lVar14 & 0x3fffffff;
      *(uint *)((long)&uStack_1b8 + lVar5 * 4 + 4) = (uint)lVar10 & 0x3fffffff;
      lVar5 = lVar5 + 1;
      uVar20 = lVar10 >> 0x1e;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(lVar14 >> 0x1e);
    } while (lVar5 != 9);
    sStack_1b0.modulus.v[8] = (int32_t)uVar20;
    psVar17 = &sStack_1f0;
    uVar45 = 9;
    uVar33 = 0xffffffff;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a3c3;
    psVar25 = psVar17;
    sStack_1f0.modulus.v[8] = (int32_t)modinfo_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&psStack_218->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a590;
    uVar45 = 9;
    uVar33 = 1;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a3e0;
    psVar25 = psVar17;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&unaff_R13->modulus,1);
    if (0 < iVar3) goto LAB_0014a595;
    psVar17 = &sStack_1b0;
    uVar45 = 9;
    uVar33 = 0xffffffff;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a402;
    psVar25 = psVar17;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&unaff_R13->modulus,-1);
    if (iVar3 < 1) goto LAB_0014a59a;
    uVar45 = 9;
    uVar33 = 1;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a41f;
    psVar25 = psVar17;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&unaff_R13->modulus,1);
    if (-1 < iVar3) goto LAB_0014a59f;
    iVar3 = iStack_20c + 1;
  } while (iVar3 != 0x14);
  psVar25 = &sStack_1b0;
  uVar45 = 9;
  uVar33 = 0;
  psStack_228 = (secp256k1_modinv32_modinfo *)0x14a44e;
  iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar25->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar3 == 0) {
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a471;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_1f0.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar17 = psStack_1c8;
    if (iVar3 == 0) {
LAB_0014a518:
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a52d;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_180,(int32_t)modinfo_00,unaff_R13);
      (psVar17->modulus).v[8] = auStack_180._32_4_;
      *(undefined8 *)((psVar17->modulus).v + 4) = auStack_180._16_8_;
      *(undefined8 *)((psVar17->modulus).v + 6) = auStack_180._24_8_;
      *(undefined8 *)(psVar17->modulus).v = auStack_180._0_8_;
      *(undefined8 *)((psVar17->modulus).v + 2) = auStack_180._8_8_;
      return;
    }
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a499;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_1f0.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar3 == 0) goto LAB_0014a518;
    uVar45 = 9;
    uVar33 = 0;
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a4b3;
    psVar25 = psVar17;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar17->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar3 == 0) {
      psVar25 = (secp256k1_modinv32_modinfo *)auStack_180;
      uVar45 = 9;
      uVar33 = 0;
      psStack_228 = (secp256k1_modinv32_modinfo *)0x14a4d6;
      iVar3 = secp256k1_modinv32_mul_cmp_30
                        ((secp256k1_modinv32_signed30 *)psVar25,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar3 == 0) {
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a4f5;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_1f0.modulus,9,&unaff_R13->modulus,1);
        if (iVar3 == 0) goto LAB_0014a518;
        psVar25 = &sStack_1f0;
        uVar45 = 9;
        uVar33 = 0xffffffff;
        psStack_228 = (secp256k1_modinv32_modinfo *)0x14a510;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&psVar25->modulus,9,&unaff_R13->modulus,-1);
        if (iVar3 == 0) goto LAB_0014a518;
      }
    }
  }
  else {
LAB_0014a5a4:
    psStack_228 = (secp256k1_modinv32_modinfo *)0x14a5a9;
    secp256k1_modinv32_cold_6();
  }
  psStack_228 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_278;
  piVar18 = (int *)(ulong)uVar33;
  pcStack_280 = (code *)0x14a5ce;
  psStack_230 = modinfo_00;
  psStack_228 = psVar17;
  secp256k1_modinv32_mul_30(&sStack_254,&psVar25->modulus,uVar45,1);
  pcStack_280 = (code *)0x14a5e0;
  piVar34 = piVar18;
  psVar22 = a_00;
  secp256k1_modinv32_mul_30(&sStack_278,a_00,9,uVar33);
  lVar5 = 0;
  while ((uint)sStack_254.v[lVar5] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_278.v[lVar5]) goto LAB_0014a632;
    lVar5 = lVar5 + 1;
    if (lVar5 == 8) {
      uVar33 = 8;
      while( true ) {
        if (sStack_254.v[uVar33] < sStack_278.v[uVar33]) {
          return;
        }
        if (sStack_278.v[uVar33] < sStack_254.v[uVar33]) break;
        bVar53 = uVar33 == 0;
        uVar33 = uVar33 - 1;
        if (bVar53) {
          return;
        }
      }
      return;
    }
  }
  pcStack_280 = (code *)0x14a632;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014a632:
  pcStack_280 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar3 = (int)a_01;
  piStack_2a8 = piVar18;
  uStack_2a0 = uVar38;
  psStack_298 = unaff_R13;
  psStack_288 = psVar50;
  pcStack_280 = (code *)uVar20;
  if (iVar3 < 1) {
    psStack_2b8 = (secp256k1_modinv32_signed30 *)0x14a725;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014a725:
    iVar8 = (int)piVar34;
    psStack_2b8 = (secp256k1_modinv32_signed30 *)0x14a72a;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar7 = piVar34[1];
    iVar1 = *piVar34;
    piVar18 = (int *)(long)psVar22->v[0];
    uVar9 = (long)*extraout_RDX * (long)iVar7 + (long)piVar18 * (long)iVar1;
    if ((uVar9 & 0x3fffffff) != 0) goto LAB_0014a725;
    iVar2 = piVar34[3];
    iVar8 = piVar34[2];
    piVar18 = (int *)((long)piVar18 * (long)iVar8);
    piVar34 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar18);
    if (((ulong)piVar34 & 0x3fffffff) == 0) {
      lVar10 = (long)piVar34 >> 0x1e;
      lVar5 = (long)uVar9 >> 0x1e;
      if (iVar3 != 1) {
        uVar38 = 1;
        do {
          lVar5 = (long)extraout_RDX[uVar38] * (long)iVar7 +
                  (long)psVar22->v[uVar38] * (long)iVar1 + lVar5;
          lVar10 = (long)extraout_RDX[uVar38] * (long)iVar2 +
                   (long)psVar22->v[uVar38] * (long)iVar8 + lVar10;
          psVar22->v[uVar38 - 1] = (uint)lVar5 & 0x3fffffff;
          extraout_RDX[uVar38 - 1] = (uint)lVar10 & 0x3fffffff;
          uVar38 = uVar38 + 1;
          lVar10 = lVar10 >> 0x1e;
          lVar5 = lVar5 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar38);
      }
      psVar22->v[(long)iVar3 + -1] = (int32_t)lVar5;
      extraout_RDX[(long)iVar3 + -1] = (int)lVar10;
      return;
    }
  }
  psStack_2b8 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar5 = 0;
  psStack_2b8 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar5 < extraout_EDX) {
      psStack_2b8 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_2b8->v + (long)psVar22->v[lVar5] * (long)iVar8);
    }
    a_01->v[lVar5] = (uint)psStack_2b8 & 0x3fffffff;
    psStack_2b8 = (secp256k1_modinv32_signed30 *)((long)psStack_2b8 >> 0x1e);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  if (8 < extraout_EDX) {
    psStack_2b8 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_2b8->v + (long)psVar22->v[8] * (long)iVar8);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_2b8;
  if (b == psStack_2b8) {
    a_01->v[8] = (int)psStack_2b8;
    return;
  }
  pcStack_2c0 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar33 = *extraout_RDX_00;
  psVar43 = (secp256k1_modinv32_signed30 *)(long)(int)uVar33;
  uVar32 = extraout_RDX_00[1];
  lVar5 = (long)(int)uVar32;
  uVar29 = extraout_RDX_00[2];
  psVar19 = (secp256k1_modinv32_signed30 *)(long)(int)uVar29;
  lStack_2f8 = (long)(int)extraout_RDX_00[3];
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_308 = (code *)0x14a7c4;
  a_02 = a_01;
  piStack_2e8 = piVar18;
  uStack_2e0 = uVar38;
  psStack_2d8 = unaff_R13;
  psStack_2c8 = psVar50;
  pcStack_2c0 = (code *)uVar20;
  iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar3 < 1) {
    pcStack_308 = (code *)0x14aa2c;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014aa2c:
    pcStack_308 = (code *)0x14aa31;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014aa31:
    pcStack_308 = (code *)0x14aa36;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014aa36:
    pcStack_308 = (code *)0x14aa3b;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014aa3b:
    pcStack_308 = (code *)0x14aa40;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014aa40:
    pcStack_308 = (code *)0x14aa45;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014aa45:
    pcStack_308 = (code *)0x14aa4a;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014aa4a:
    pcStack_308 = (code *)0x14aa4f;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar39 = b;
LAB_0014aa4f:
    pcStack_308 = (code *)0x14aa54;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014aa54:
    pcStack_308 = (code *)0x14aa59;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014aa59:
    pcStack_308 = (code *)0x14aa5e;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a7e1;
    a_02 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar3) goto LAB_0014aa2c;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a7fe;
    a_02 = psVar22;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar22,9,b,-2);
    if (iVar3 < 1) goto LAB_0014aa31;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a81b;
    a_02 = psVar22;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar22,9,b,1);
    if (-1 < iVar3) goto LAB_0014aa36;
    psVar39 = (secp256k1_modinv32_signed30 *)-(long)psVar43;
    if (0 < (long)psVar43) {
      psVar39 = psVar43;
    }
    lVar10 = -lVar5;
    if (lVar5 < 1) {
      lVar10 = lVar5;
    }
    if (lVar10 + 0x40000000 < (long)psVar39) goto LAB_0014aa3b;
    psVar39 = (secp256k1_modinv32_signed30 *)-(long)psVar19;
    if (0 < (long)psVar19) {
      psVar39 = psVar19;
    }
    lVar10 = -lStack_2f8;
    if (lStack_2f8 < 1) {
      lVar10 = lStack_2f8;
    }
    if (lVar10 + 0x40000000 < (long)psVar39) goto LAB_0014aa40;
    uVar45 = a_01->v[8] >> 0x1f;
    uVar11 = psVar22->v[8] >> 0x1f;
    psVar23 = (secp256k1_fe *)(ulong)uVar11;
    iVar3 = (uVar11 & uVar32) + (uVar45 & uVar33);
    a_02 = (secp256k1_modinv32_signed30 *)(psVar22->v[0] * lVar5 + (long)a_01->v[0] * (long)psVar43)
    ;
    lVar10 = (long)(int)(iVar3 - ((int)a_02 * b[1].v[0] + iVar3 & 0x3fffffffU));
    piVar13 = (int32_t *)((long)a_02->v + lVar10 * b->v[0]);
    if (((ulong)piVar13 & 0x3fffffff) != 0) goto LAB_0014aa45;
    lStack_2f0 = lVar10;
    iVar3 = (uVar11 & (uint)lStack_2f8) + (uVar45 & uVar29);
    lVar12 = psVar22->v[0] * lStack_2f8 + (long)a_01->v[0] * (long)psVar19;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar33 = iVar3 - (b[1].v[0] * (int)lVar12 + iVar3 & 0x3fffffffU);
    psVar23 = (secp256k1_fe *)(ulong)uVar33;
    uVar38 = (long)b->v[0] * (long)(int)uVar33 + lVar12;
    if ((uVar38 & 0x3fffffff) != 0) goto LAB_0014aa4a;
    lVar12 = (long)uVar38 >> 0x1e;
    lVar14 = (long)piVar13 >> 0x1e;
    lVar26 = 1;
    do {
      lVar14 = b->v[lVar26] * lVar10 + psVar22->v[lVar26] * lVar5 +
               (long)a_01->v[lVar26] * (long)psVar43 + lVar14;
      psVar39 = (secp256k1_modinv32_signed30 *)(psVar22->v[lVar26] * lStack_2f8);
      lVar12 = (long)psVar39->v +
               (long)a_01->v[lVar26] * (long)psVar19 + lVar12 +
               (long)b->v[lVar26] * (long)(int)uVar33;
      a_01->v[lVar26 + -1] = (uint)lVar14 & 0x3fffffff;
      psVar22->v[lVar26 + -1] = (uint)lVar12 & 0x3fffffff;
      lVar26 = lVar26 + 1;
      lVar12 = lVar12 >> 0x1e;
      lVar14 = lVar14 >> 0x1e;
    } while (lVar26 != 9);
    a_01->v[8] = (int32_t)lVar14;
    psVar22->v[8] = (int32_t)lVar12;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a9c5;
    a_02 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar19 = psVar22;
    psVar43 = b;
    if (iVar3 < 1) goto LAB_0014aa4f;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a9e2;
    a_02 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar3) goto LAB_0014aa54;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14a9fb;
    a_02 = psVar22;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar22,9,b,-2);
    if (iVar3 < 1) goto LAB_0014aa59;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_308 = (code *)0x14aa14;
    a_02 = psVar22;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar22,9,b,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_308 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_308 = (code *)lVar5;
  psStack_310 = a_01;
  psStack_318 = psVar22;
  psStack_320 = psVar43;
  psStack_328 = psVar39;
  psStack_330 = psVar19;
  uVar33 = a_02->v[0];
  uVar24 = (ulong)uVar33;
  uVar32 = a_02->v[3];
  uVar15 = (ulong)uVar32;
  uVar29 = a_02->v[4];
  uVar9 = (ulong)uVar29;
  uVar11 = a_02->v[5];
  uVar20 = (ulong)uVar11;
  psVar22 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar45 = a_02->v[7];
  uVar38 = (ulong)uVar45;
  iStack_334 = a_02->v[8];
  lVar5 = 0;
  do {
    if (a_02->v[lVar5] < -0x3fffffff) {
      pcStack_370 = (code *)0x14adac;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014adac:
      pcStack_370 = (code *)0x14adb1;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014adb1;
    }
    if (0x3fffffff < a_02->v[lVar5]) goto LAB_0014adac;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  uStack_354 = (uint)psVar23;
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_370 = (code *)0x14aae9;
  psVar22 = a_02;
  uStack_360 = a_02->v[1];
  uStack_35c = a_02->v[2];
  uStack_358 = a_02->v[6];
  psStack_350 = b_00;
  iVar3 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar3 < 1) {
LAB_0014adb1:
    pcStack_370 = (code *)0x14adb6;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014adb6:
    pcStack_370 = (code *)0x14adbb;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014adbb:
    pcStack_370 = (code *)0x14adc0;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014adc0:
    pcStack_370 = (code *)0x14adc5;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_370 = (code *)0x14ab08;
    psVar22 = a_02;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_350,1);
    if (-1 < iVar3) goto LAB_0014adb6;
    uVar16 = iStack_334 >> 0x1f;
    uStack_338 = psStack_350->v[1];
    uVar35 = (uVar16 & uStack_338) + uStack_360;
    uStack_360 = psStack_350->v[2];
    uVar40 = (uVar16 & uStack_360) + uStack_35c;
    uStack_35c = psStack_350->v[3];
    uStack_33c = psStack_350->v[4];
    uStack_340 = psStack_350->v[5];
    uStack_344 = psStack_350->v[6];
    uVar41 = (uVar16 & uStack_344) + uStack_358;
    uStack_358 = psStack_350->v[7];
    uStack_364 = (int)uStack_354 >> 0x1f;
    uStack_354 = psStack_350->v[8];
    uVar36 = ((uVar16 & psStack_350->v[0]) + uVar33 ^ uStack_364) - uStack_364;
    uVar46 = ((int)uVar36 >> 0x1e) + ((uVar35 ^ uStack_364) - uStack_364);
    uVar35 = ((int)uVar46 >> 0x1e) + ((uVar40 ^ uStack_364) - uStack_364);
    uVar49 = ((int)uVar35 >> 0x1e) + (((uVar16 & uStack_35c) + uVar32 ^ uStack_364) - uStack_364);
    uVar32 = ((int)uVar49 >> 0x1e) + (((uVar16 & uStack_33c) + uVar29 ^ uStack_364) - uStack_364);
    uVar33 = ((int)uVar32 >> 0x1e) + (((uVar16 & uStack_340) + uVar11 ^ uStack_364) - uStack_364);
    uVar29 = ((int)uVar33 >> 0x1e) + ((uVar41 ^ uStack_364) - uStack_364);
    uVar11 = ((int)uVar29 >> 0x1e) + (((uVar16 & uStack_358) + uVar45 ^ uStack_364) - uStack_364);
    uVar37 = ((int)uVar11 >> 0x1e) +
             (((uVar16 & uStack_354) + iStack_334 ^ uStack_364) - uStack_364);
    uVar20 = (ulong)uVar37;
    uStack_368 = (int)uVar37 >> 0x1f;
    uVar41 = (psStack_350->v[0] & uStack_368) + (uVar36 & 0x3fffffff);
    uVar40 = (uStack_340 & uStack_368) + (uVar33 & 0x3fffffff);
    uVar24 = (ulong)uVar40;
    uVar36 = (uStack_344 & uStack_368) + (uVar29 & 0x3fffffff);
    uVar15 = (ulong)uVar36;
    uVar33 = ((int)uVar41 >> 0x1e) + (uStack_338 & uStack_368) + (uVar46 & 0x3fffffff);
    uVar29 = ((int)uVar33 >> 0x1e) + (uStack_360 & uStack_368) + (uVar35 & 0x3fffffff);
    uVar45 = ((int)uVar29 >> 0x1e) + (uStack_35c & uStack_368) + (uVar49 & 0x3fffffff);
    uVar16 = ((int)uVar45 >> 0x1e) + (uStack_33c & uStack_368) + (uVar32 & 0x3fffffff);
    uVar40 = ((int)uVar16 >> 0x1e) + uVar40;
    uVar36 = ((int)uVar40 >> 0x1e) + uVar36;
    uVar32 = ((int)uVar36 >> 0x1e) + (uStack_358 & uStack_368) + (uVar11 & 0x3fffffff);
    uVar11 = ((int)uVar32 >> 0x1e) + (uStack_354 & uStack_368) + uVar37;
    uVar9 = (ulong)uVar11;
    uVar45 = uVar45 & 0x3fffffff;
    psVar23 = (secp256k1_fe *)(ulong)uVar45;
    uVar16 = uVar16 & 0x3fffffff;
    psVar22 = (secp256k1_modinv32_signed30 *)(ulong)uVar16;
    uVar32 = uVar32 & 0x3fffffff;
    uVar38 = (ulong)uVar32;
    a_02->v[0] = uVar41 & 0x3fffffff;
    a_02->v[1] = uVar33 & 0x3fffffff;
    a_02->v[2] = uVar29 & 0x3fffffff;
    a_02->v[3] = uVar45;
    a_02->v[4] = uVar16;
    a_02->v[5] = uVar40 & 0x3fffffff;
    a_02->v[6] = uVar36 & 0x3fffffff;
    a_02->v[7] = uVar32;
    a_02->v[8] = uVar11;
    if (0x3fffffff < uVar11) goto LAB_0014adbb;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_370 = (code *)0x14ad79;
    psVar22 = a_02;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_350,0);
    if (iVar3 < 0) goto LAB_0014adc0;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_370 = (code *)0x14ad94;
    psVar22 = a_02;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_350,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_370 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_408 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_408 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_458 = (code *)0x14ae01;
  uStack_398 = uVar38;
  uStack_390 = uVar20;
  uStack_388 = uVar15;
  psStack_380 = a_02;
  uStack_378 = uVar24;
  pcStack_370 = (code *)uVar9;
  (*(code *)psStack_408)(&sStack_440);
  if (psVar22 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar22->v + 8) = sStack_440.n[4];
    *(ulong *)(psVar22[1].v + 1) = CONCAT44(sStack_440.normalized,sStack_440.magnitude);
    *(uint64_t *)(psVar22->v + 4) = sStack_440.n[2];
    *(uint64_t *)(psVar22->v + 6) = sStack_440.n[3];
    *(uint64_t *)psVar22->v = sStack_440.n[0];
    *(uint64_t *)(psVar22->v + 2) = sStack_440.n[1];
  }
  uVar51 = 0xfffffffffffff;
  uVar44 = 0xf000000000000;
  uVar9 = 0xffffffffffff;
  uVar20 = 0x1000003d0;
  sStack_3d0.n[0] = psVar23->n[0];
  sStack_3d0.n[1] = psVar23->n[1];
  sStack_3d0.n[2] = psVar23->n[2];
  sStack_3d0.n[3] = psVar23->n[3];
  sStack_3d0.n[4] = psVar23->n[4];
  sStack_3d0.magnitude = psVar23->magnitude;
  sStack_3d0.normalized = psVar23->normalized;
  a_03 = &sStack_3d0;
  pcStack_458 = (code *)0x14ae78;
  secp256k1_fe_verify(a_03);
  lStack_448 = 0x1000003d1;
  uVar38 = (sStack_3d0.n[4] >> 0x30) * 0x1000003d1 + sStack_3d0.n[0];
  if (((uVar38 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar38 & 0xfffffffffffff) == 0)) {
    uVar15 = (uVar38 >> 0x34) + sStack_3d0.n[1];
    uVar24 = (uVar15 >> 0x34) + sStack_3d0.n[2];
    uVar27 = (uVar24 >> 0x34) + sStack_3d0.n[3];
    uVar30 = (uVar27 >> 0x34) + (sStack_3d0.n[4] & 0xffffffffffff);
    if ((((uVar15 | uVar38 | uVar24 | uVar27) & 0xfffffffffffff) != 0 || uVar30 != 0) &&
       (((uVar38 | 0x1000003d0) & uVar15 & uVar24 & uVar27 & (uVar30 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014af1b;
LAB_0014b32f:
    psVar23 = &sStack_440;
    pcStack_458 = (code *)0x14b33c;
    secp256k1_fe_verify(psVar23);
    uVar9 = uVar9 & sStack_440.n[4];
    uVar38 = (sStack_440.n[4] >> 0x30) * lStack_448 + sStack_440.n[0];
    uVar15 = (uVar38 >> 0x34) + sStack_440.n[1];
    uVar24 = (uVar15 >> 0x34) + sStack_440.n[2];
    r = (secp256k1_fe *)((uVar24 >> 0x34) + sStack_440.n[3]);
    uVar27 = ((ulong)r >> 0x34) + uVar9;
    if ((((uVar15 | uVar38 | uVar24 | (ulong)r) & uVar51) == 0 && uVar27 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar27 ^ uVar44),
       ((uVar38 ^ uVar20) & uVar15 & uVar24 & (ulong)r & (ulong)r_00) == uVar51)) {
      return;
    }
  }
  else {
LAB_0014af1b:
    pcStack_458 = (code *)0x14af33;
    r = psVar23;
    secp256k1_fe_mul(&sStack_3d0,psVar23,&sStack_440);
    pcStack_458 = (code *)0x14af3b;
    secp256k1_fe_verify(&sStack_3d0);
    r_00 = &fe_minus_one;
    pcStack_458 = (code *)0x14af47;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_3d0.magnitude < 0x20) {
      sStack_3d0.n[0] = sStack_3d0.n[0] + 0xffffefffffc2e;
      sStack_3d0.n[1] = sStack_3d0.n[1] + 0xfffffffffffff;
      sStack_3d0.n[2] = sStack_3d0.n[2] + 0xfffffffffffff;
      sStack_3d0.n[3] = sStack_3d0.n[3] + 0xfffffffffffff;
      sStack_3d0.n[4] = sStack_3d0.n[4] + 0xffffffffffff;
      sStack_3d0.normalized = 0;
      sStack_3d0.magnitude = sStack_3d0.magnitude + 1;
      pcStack_458 = (code *)0x14af9c;
      secp256k1_fe_verify(&sStack_3d0);
      pcStack_458 = (code *)0x14afa4;
      secp256k1_fe_verify(&sStack_3d0);
      uVar38 = (sStack_3d0.n[4] >> 0x30) * lStack_448 + sStack_3d0.n[0];
      uVar9 = (uVar38 >> 0x34) + sStack_3d0.n[1];
      uVar15 = (uVar9 >> 0x34) + sStack_3d0.n[2];
      r = (secp256k1_fe *)((uVar15 >> 0x34) + sStack_3d0.n[3]);
      uVar24 = ((ulong)r >> 0x34) + (sStack_3d0.n[4] & 0xffffffffffff);
      if ((((uVar9 | uVar38 | uVar15 | (ulong)r) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar24 ^ 0xf000000000000),
         ((uVar38 ^ 0x1000003d0) & uVar9 & uVar15 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014b3bd;
      sStack_400.n[0] = psVar23->n[0];
      sStack_400.n[1] = psVar23->n[1];
      sStack_400.n[2] = psVar23->n[2];
      sStack_400.n[3] = psVar23->n[3];
      sStack_400.n[4] = psVar23->n[4];
      sStack_400.magnitude = psVar23->magnitude;
      sStack_400.normalized = psVar23->normalized;
      psVar23 = &sStack_400;
      pcStack_458 = (code *)0x14b03c;
      secp256k1_fe_verify(psVar23);
      r_00 = &fe_minus_one;
      pcStack_458 = (code *)0x14b048;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_400.magnitude) goto LAB_0014b3c2;
      uVar21 = sStack_400.n[0] + 0xffffefffffc2e;
      uVar48 = sStack_400.n[1] + 0xfffffffffffff;
      uVar51 = sStack_400.n[2] + 0xfffffffffffff;
      uVar44 = sStack_400.n[3] + 0xfffffffffffff;
      uVar20 = sStack_400.n[4] + 0xffffffffffff;
      sStack_400.normalized = 0;
      sStack_400.magnitude = sStack_400.magnitude + 1;
      pcStack_458 = (code *)0x14b0bd;
      sStack_400.n[0] = uVar21;
      sStack_400.n[1] = uVar48;
      sStack_400.n[2] = uVar51;
      sStack_400.n[3] = uVar44;
      sStack_400.n[4] = uVar20;
      secp256k1_fe_verify(&sStack_400);
      pcStack_458 = (code *)0x14b0c5;
      secp256k1_fe_verify(&sStack_400);
      a_03 = psStack_408;
      uVar38 = (uVar20 >> 0x30) * lStack_448 + uVar21;
      if (((uVar38 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar38 & 0xfffffffffffff) == 0)) {
        uVar20 = uVar20 & 0xffffffffffff;
        uVar27 = uVar48 + (uVar38 >> 0x34);
        uVar9 = (uVar27 >> 0x34) + uVar51;
        uVar15 = (uVar9 >> 0x34) + uVar44;
        uVar24 = (uVar15 >> 0x34) + uVar20;
        if (((uVar27 | uVar38 | uVar9 | uVar15) & 0xfffffffffffff) == 0 && uVar24 == 0) {
          return;
        }
        if (((uVar38 | 0x1000003d0) & uVar27 & uVar9 & uVar15 & (uVar24 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_400;
      pcStack_458 = (code *)0x14b185;
      (*(code *)psStack_408)();
      psVar23 = &sStack_440;
      pcStack_458 = (code *)0x14b192;
      secp256k1_fe_verify(psVar23);
      r_00 = &fe_minus_one;
      pcStack_458 = (code *)0x14b19e;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_440.magnitude) goto LAB_0014b3c7;
      psVar23 = &sStack_440;
      sStack_440.n[0] = sStack_440.n[0] + 0xffffefffffc2e;
      sStack_440.n[1] = sStack_440.n[1] + 0xfffffffffffff;
      sStack_440.n[2] = sStack_440.n[2] + 0xfffffffffffff;
      sStack_440.n[3] = sStack_440.n[3] + 0xfffffffffffff;
      sStack_440.n[4] = sStack_440.n[4] + 0xffffffffffff;
      sStack_440.magnitude = sStack_440.magnitude + 1;
      uVar9 = 0;
      sStack_440.normalized = 0;
      pcStack_458 = (code *)0x14b1e7;
      secp256k1_fe_verify(psVar23);
      pcStack_458 = (code *)0x14b1f0;
      r = psVar23;
      (*(code *)a_03)(psVar23);
      pcStack_458 = (code *)0x14b1f8;
      secp256k1_fe_verify(psVar23);
      sStack_440.n[0] = sStack_440.n[0] + 1;
      sStack_440.magnitude = sStack_440.magnitude + 1;
      sStack_440.normalized = 0;
      pcStack_458 = (code *)0x14b209;
      secp256k1_fe_verify(psVar23);
      pcStack_458 = (code *)0x14b211;
      secp256k1_fe_verify(psVar23);
      a_03 = &sStack_400;
      pcStack_458 = (code *)0x14b21e;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_400.magnitude + sStack_440.magnitude < 0x21) {
        sStack_440.n[0] = sStack_440.n[0] + sStack_400.n[0];
        sStack_440.n[1] = sStack_440.n[1] + sStack_400.n[1];
        sStack_440.n[2] = sStack_440.n[2] + sStack_400.n[2];
        sStack_440.n[3] = sStack_440.n[3] + sStack_400.n[3];
        sStack_440.n[4] = sStack_440.n[4] + sStack_400.n[4];
        sStack_440.normalized = 0;
        pcStack_458 = (code *)0x14b26c;
        sStack_440.magnitude = sStack_400.magnitude + sStack_440.magnitude;
        secp256k1_fe_verify(&sStack_440);
        pcStack_458 = (code *)0x14b274;
        secp256k1_fe_verify(&sStack_440);
        uVar38 = (sStack_440.n[4] >> 0x30) * lStack_448 + sStack_440.n[0];
        if (((uVar38 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar38 & 0xfffffffffffff) == 0)) {
          uVar15 = (uVar38 >> 0x34) + sStack_440.n[1];
          uVar24 = (uVar15 >> 0x34) + sStack_440.n[2];
          uVar27 = (uVar24 >> 0x34) + sStack_440.n[3];
          uVar30 = (uVar27 >> 0x34) + (sStack_440.n[4] & 0xffffffffffff);
          if (((uVar15 | uVar38 | uVar24 | uVar27) & 0xfffffffffffff) == 0 && uVar30 == 0) {
            return;
          }
          if (((uVar38 | 0x1000003d0) & uVar15 & uVar24 & uVar27 & (uVar30 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_458 = (code *)0x14b32f;
        test_inverse_field_cold_2();
        goto LAB_0014b32f;
      }
    }
    else {
      pcStack_458 = (code *)0x14b3bd;
      test_inverse_field_cold_7();
LAB_0014b3bd:
      pcStack_458 = (code *)0x14b3c2;
      test_inverse_field_cold_6();
LAB_0014b3c2:
      a_03 = &sStack_3d0;
      pcStack_458 = (code *)0x14b3c7;
      test_inverse_field_cold_5();
LAB_0014b3c7:
      uVar9 = 0xffffffffffff;
      pcStack_458 = (code *)0x14b3cc;
      test_inverse_field_cold_4();
    }
    pcStack_458 = (code *)0x14b3d1;
    test_inverse_field_cold_3();
  }
  pcStack_458 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar28 = (secp256k1_fe *)auStack_4c8;
  pcVar52 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar52 = secp256k1_scalar_inverse;
  }
  pcStack_4d0 = (code *)0x14b3ff;
  auStack_488._32_8_ = psVar23;
  auStack_488._40_8_ = a_03;
  pcStack_458 = (code *)uVar51;
  (*pcVar52)(auStack_4c8);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_4c8._20_4_,auStack_4c8._16_4_);
    r_00->n[3] = CONCAT44(auStack_4c8._28_4_,auStack_4c8._24_4_);
    r_00->n[0] = CONCAT44(auStack_4c8._4_4_,auStack_4c8._0_4_);
    r_00->n[1] = CONCAT44(auStack_4c8._12_4_,auStack_4c8._8_4_);
  }
  pcStack_4d0 = (code *)0x14b41e;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar54._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar54._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar54._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar54._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar3 = movmskps(extraout_EAX,auVar54);
  if (iVar3 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_488;
    pcStack_4d0 = (code *)0x14b452;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14b45a;
    psVar23 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_488._0_8_ != 1 || auStack_488._8_8_ != 0) || auStack_488._16_8_ != 0) ||
        auStack_488._24_8_ != 0) {
      pcStack_4d0 = (code *)0x14b564;
      test_inverse_scalar_cold_1();
      goto LAB_0014b564;
    }
    pcStack_4d0 = (code *)0x14b48a;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_4c8 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_4d0 = (code *)0x14b492;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_4c8 + 0x20));
    auVar55._0_4_ = -(uint)(iStack_498 == 0 && auStack_4c8._32_4_ == 0);
    auVar55._4_4_ = -(uint)(iStack_494 == 0 && iStack_4a4 == 0);
    auVar55._8_4_ = -(uint)(iStack_490 == 0 && iStack_4a0 == 0);
    auVar55._12_4_ = -(uint)(iStack_48c == 0 && iStack_49c == 0);
    iVar3 = movmskps(extraout_EAX_00,auVar55);
    if (iVar3 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_4c8 + 0x20);
    pcStack_4d0 = (code *)0x14b4c3;
    (*pcVar52)(a,a);
    pcStack_4d0 = (code *)0x14b4d8;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_4c8,&scalar_minus_one,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14b4e1;
    (*pcVar52)(auStack_4c8,auStack_4c8);
    pcStack_4d0 = (code *)0x14b4f3;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_4c8,(secp256k1_scalar *)auStack_4c8,&secp256k1_scalar_one
              );
    pcStack_4d0 = (code *)0x14b501;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_4c8,a,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14b509;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_4c8);
    auVar56._0_4_ = -(uint)(auStack_4c8._16_4_ == 0 && auStack_4c8._0_4_ == 0);
    auVar56._4_4_ = -(uint)(auStack_4c8._20_4_ == 0 && auStack_4c8._4_4_ == 0);
    auVar56._8_4_ = -(uint)(auStack_4c8._24_4_ == 0 && auStack_4c8._8_4_ == 0);
    auVar56._12_4_ = -(uint)(auStack_4c8._28_4_ == 0 && auStack_4c8._12_4_ == 0);
    iVar3 = movmskps(extraout_EAX_01,auVar56);
    if (iVar3 == 0xf) {
      return;
    }
    pcStack_4d0 = (code *)0x14b52d;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_4c8;
  }
  pcStack_4d0 = (code *)0x14b538;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_4c8);
  auVar57._0_4_ = -(uint)(auStack_4c8._16_4_ == 0 && auStack_4c8._0_4_ == 0);
  auVar57._4_4_ = -(uint)(auStack_4c8._20_4_ == 0 && auStack_4c8._4_4_ == 0);
  auVar57._8_4_ = -(uint)(auStack_4c8._24_4_ == 0 && auStack_4c8._8_4_ == 0);
  auVar57._12_4_ = -(uint)(auStack_4c8._28_4_ == 0 && auStack_4c8._12_4_ == 0);
  iVar3 = movmskps(extraout_EAX_02,auVar57);
  r = (secp256k1_fe *)auStack_4c8;
  psVar23 = psVar28;
  if (iVar3 == 0xf) {
    return;
  }
LAB_0014b564:
  pcStack_4d0 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1580;
  psStack_4f8 = r;
  uStack_4f0 = uVar20;
  uStack_4e8 = uVar44;
  psStack_4e0 = r_00;
  pcStack_4d8 = pcVar52;
  pcStack_4d0 = (code *)uVar9;
  memset(__s,0,0x1081);
  uStack_1590 = 0;
  lVar5 = 0x41;
  psStack_1588 = psVar23;
  secp256k1_hsort(__s,0x41,(size_t)psVar23,test_hsort_cmp,&uStack_1590);
  if (0x3f < uStack_1590) {
    test_hsort_is_sorted(auStack_1580,0x41,(size_t)psVar23);
    if (0 < COUNT) {
      iVar3 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_1580,count * (long)psVar23);
        secp256k1_hsort(auStack_1580,count,(size_t)psVar23,test_hsort_cmp,&uStack_1590);
        test_hsort_is_sorted(auStack_1580,count,(size_t)psVar23);
        iVar3 = iVar3 + 1;
      } while (iVar3 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar10 = 0;
    do {
      if (__s[lVar10] != *(uchar *)(lVar5 + lVar10)) {
        return;
      }
      lVar10 = lVar10 + 1;
    } while (extraout_RDX_01[1] != lVar10);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}